

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O3

void duckdb::SetBitOperation(DataChunk *args,ExpressionState *state,Vector *result)

{
  UnifiedVectorFormat *pUVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  anon_union_16_2_67f50693_for_value *paVar3;
  byte bVar4;
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  UnifiedVectorFormat *pUVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  _Head_base<0UL,_unsigned_long_*,_false> _Var12;
  UnifiedVectorFormat *pUVar13;
  UnifiedVectorFormat *pUVar14;
  ValidityMask *in_R9;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar15;
  undefined8 *puVar16;
  string_t a;
  string_t sVar17;
  anon_struct_16_3_d7536bce_for_pointer aVar18;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  idx_t in_stack_fffffffffffffeb8;
  idx_t iVar19;
  undefined8 local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  Vector *local_118;
  unsigned_long local_110;
  long *local_108;
  idx_t local_100;
  long local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pvVar7 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  pvVar8 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  pvVar9 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,2);
  pUVar1 = *(UnifiedVectorFormat **)(args + 0x18);
  if (((*pvVar7 == (value_type)0x2) && (*pvVar8 == (value_type)0x2)) && (*pvVar9 == (value_type)0x2)
     ) {
    duckdb::Vector::SetVectorType((VectorType)result);
    if ((((*(byte **)(pvVar7 + 0x28) != (byte *)0x0) && ((**(byte **)(pvVar7 + 0x28) & 1) == 0)) ||
        ((*(byte **)(pvVar8 + 0x28) != (byte *)0x0 && ((**(byte **)(pvVar8 + 0x28) & 1) == 0)))) ||
       ((*(byte **)(pvVar9 + 0x28) != (byte *)0x0 && ((**(byte **)(pvVar9 + 0x28) & 1) == 0)))) {
      duckdb::ConstantVector::SetNull(result,true);
      return;
    }
    paVar3 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
    aVar18 = (anon_struct_16_3_d7536bce_for_pointer)
             TernaryLambdaWrapper::
             Operation<duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,int,int,duckdb::string_t>
                       ((anon_class_8_1_6971b95b)result,
                        (string_t)(*(anon_union_16_2_67f50693_for_value **)(pvVar7 + 0x20))->pointer
                        ,**(int **)(pvVar8 + 0x20),**(int **)(pvVar9 + 0x20),in_R9,
                        in_stack_fffffffffffffeb8);
    paVar3->pointer = aVar18;
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_108);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar7,pUVar1);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar8,pUVar1);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar9,pUVar1);
    lVar2 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    if (((local_68 == 0) && (local_b0 == 0)) && (local_f8 == 0)) {
      if (pUVar1 != (UnifiedVectorFormat *)0x0) {
        puVar16 = (undefined8 *)(lVar2 + 8);
        pUVar15 = (UnifiedVectorFormat *)0x0;
        iVar19 = local_100;
        do {
          pUVar10 = pUVar15;
          if (*local_78 != 0) {
            pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_78 + (long)pUVar15 * 4);
          }
          pUVar13 = pUVar15;
          if (*local_c0 != 0) {
            pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar15 * 4);
          }
          pUVar14 = pUVar15;
          if (*local_108 != 0) {
            pUVar14 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_108 + (long)pUVar15 * 4);
          }
          a.value.pointer.ptr = (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar10 * 0x10);
          a.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar10 * 0x10);
          sVar17 = TernaryLambdaWrapper::
                   Operation<duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,int,int,duckdb::string_t>
                             ((anon_class_8_1_6971b95b)result,a,
                              *(int *)(local_b8 + (long)pUVar13 * 4),
                              *(int *)(iVar19 + (long)pUVar14 * 4),in_R9,iVar19);
          puVar16[-1] = sVar17.value._0_8_;
          *puVar16 = sVar17.value._8_8_;
          pUVar15 = pUVar15 + 1;
          puVar16 = puVar16 + 2;
        } while (pUVar1 != pUVar15);
      }
    }
    else if (pUVar1 != (UnifiedVectorFormat *)0x0) {
      local_118 = result + 0x30;
      puVar16 = (undefined8 *)(lVar2 + 8);
      pUVar15 = (UnifiedVectorFormat *)0x0;
      iVar19 = local_100;
      do {
        pUVar10 = pUVar15;
        if (*local_78 != 0) {
          pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_78 + (long)pUVar15 * 4);
        }
        pUVar13 = pUVar15;
        if (*local_c0 != 0) {
          pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar15 * 4);
        }
        pUVar14 = pUVar15;
        if (*local_108 != 0) {
          pUVar14 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_108 + (long)pUVar15 * 4);
        }
        if (((local_68 == 0) ||
            ((*(ulong *)(local_68 + ((ulong)pUVar10 >> 6) * 8) >> ((ulong)pUVar10 & 0x3f) & 1) != 0)
            ) && (((local_b0 == 0 ||
                   ((*(ulong *)(local_b0 + ((ulong)pUVar13 >> 6) * 8) >> ((ulong)pUVar13 & 0x3f) & 1
                    ) != 0)) &&
                  ((local_f8 == 0 ||
                   ((*(ulong *)(local_f8 + ((ulong)pUVar14 >> 6) * 8) >> ((ulong)pUVar14 & 0x3f) & 1
                    ) != 0)))))) {
          sVar17.value.pointer.ptr = (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar10 * 0x10);
          sVar17.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar10 * 0x10);
          sVar17 = TernaryLambdaWrapper::
                   Operation<duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,int,int,duckdb::string_t>
                             ((anon_class_8_1_6971b95b)result,sVar17,
                              *(int *)(local_b8 + (long)pUVar13 * 4),
                              *(int *)(iVar19 + (long)pUVar14 * 4),in_R9,iVar19);
          puVar16[-1] = sVar17.value._0_8_;
          *puVar16 = sVar17.value._8_8_;
        }
        else {
          _Var12._M_head_impl = *(unsigned_long **)(result + 0x28);
          if (_Var12._M_head_impl == (unsigned_long *)0x0) {
            local_110 = *(unsigned_long *)(result + 0x40);
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_128,&local_110);
            p_Var6 = p_Stack_120;
            uVar5 = local_128;
            local_128 = 0;
            p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(undefined8 *)(result + 0x30) = uVar5;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var6;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 local_118);
            _Var12._M_head_impl =
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(unsigned_long **)(result + 0x28) = _Var12._M_head_impl;
          }
          bVar4 = (byte)pUVar15 & 0x3f;
          _Var12._M_head_impl[(ulong)pUVar15 >> 6] =
               _Var12._M_head_impl[(ulong)pUVar15 >> 6] &
               (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
        }
        pUVar15 = pUVar15 + 1;
        puVar16 = puVar16 + 2;
      } while (pUVar1 != pUVar15);
    }
    if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
    }
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void SetBitOperation(DataChunk &args, ExpressionState &state, Vector &result) {
	TernaryExecutor::Execute<string_t, int32_t, int32_t, string_t>(
	    args.data[0], args.data[1], args.data[2], result, args.size(),
	    [&](string_t input, int32_t n, int32_t new_value) {
		    if (new_value != 0 && new_value != 1) {
			    throw InvalidInputException("The new bit must be 1 or 0");
		    }
		    if (n < 0 || (idx_t)n > Bit::BitLength(input) - 1) {
			    throw OutOfRangeException("bit index %s out of valid range (0..%s)", NumericHelper::ToString(n),
			                              NumericHelper::ToString(Bit::BitLength(input) - 1));
		    }
		    string_t target = StringVector::EmptyString(result, input.GetSize());
		    memcpy(target.GetDataWriteable(), input.GetData(), input.GetSize());
		    Bit::SetBit(target, UnsafeNumericCast<idx_t>(n), UnsafeNumericCast<idx_t>(new_value));
		    return target;
	    });
}